

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O0

void __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<int>::VertexBufferObject
          (VertexBufferObject<int> *this,Functions *gl,GLenum target,
          vector<int,_std::allocator<int>_> *data)

{
  glBufferDataFunc p_Var1;
  GLenum GVar2;
  size_type sVar3;
  reference pvVar4;
  socklen_t __len;
  sockaddr *__addr;
  int iVar5;
  vector<int,_std::allocator<int>_> *data_local;
  GLenum target_local;
  Functions *gl_local;
  VertexBufferObject<int> *this_local;
  
  this->m_gl = gl;
  this->m_vertex_buffer_object_id = 0;
  this->m_target = target;
  this->m_size = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_enabled_arrays);
  (*this->m_gl->genBuffers)(1,&this->m_vertex_buffer_object_id);
  GVar2 = (*this->m_gl->getError)();
  iVar5 = 0x29b575f;
  __len = 0x14f;
  glu::checkError(GVar2,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                  ,0x14f);
  if (this->m_vertex_buffer_object_id != 0) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(data);
    this->m_size = (int)sVar3 << 2;
    bind(this,iVar5,__addr,__len);
    p_Var1 = this->m_gl->bufferData;
    GVar2 = this->m_target;
    iVar5 = this->m_size;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](data,0);
    (*p_Var1)(GVar2,(long)iVar5,pvVar4,0x88e4);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                    ,0x158);
  }
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::VertexBufferObject<T>::VertexBufferObject(const glw::Functions& gl,
																		 const glw::GLenum target, std::vector<T> data)
	: m_gl(gl), m_vertex_buffer_object_id(0), m_target(target), m_size(0)
{
	m_gl.genBuffers(1, &m_vertex_buffer_object_id);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers call failed.");

	if (m_vertex_buffer_object_id)
	{
		m_size = (glw::GLsizei)(sizeof(T) * data.size());

		bind();

		m_gl.bufferData(m_target, m_size, &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferData call failed.");
	}
}